

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O2

void __thiscall
LASreadItemCompressed_POINT10_v1::~LASreadItemCompressed_POINT10_v1
          (LASreadItemCompressed_POINT10_v1 *this)

{
  IntegerCompressor *pIVar1;
  ArithmeticModel *pAVar2;
  long lVar3;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015f778;
  pIVar1 = this->ic_dx;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_dy;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_z;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_intensity;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_scan_angle_rank;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_point_source_ID;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  ArithmeticDecoder::destroySymbolModel(this->dec,this->m_changed_values);
  for (lVar3 = -0x800; lVar3 != 0; lVar3 = lVar3 + 8) {
    pAVar2 = *(ArithmeticModel **)((long)this->m_classification + lVar3);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,pAVar2);
    }
    pAVar2 = *(ArithmeticModel **)((long)this->m_user_data + lVar3);
    if (pAVar2 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec,pAVar2);
    }
    if (*(ArithmeticModel **)(this[1].last_item + lVar3 + -0x10) != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel
                (this->dec,*(ArithmeticModel **)(this[1].last_item + lVar3 + -0x10));
    }
  }
  return;
}

Assistant:

LASreadItemCompressed_POINT10_v1::~LASreadItemCompressed_POINT10_v1()
{
  U32 i;

  delete ic_dx;
  delete ic_dy;
  delete ic_z;
  delete ic_intensity;
  delete ic_scan_angle_rank;
  delete ic_point_source_ID;
  dec->destroySymbolModel(m_changed_values);
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) dec->destroySymbolModel(m_bit_byte[i]);
    if (m_classification[i]) dec->destroySymbolModel(m_classification[i]);
    if (m_user_data[i]) dec->destroySymbolModel(m_user_data[i]);
  }
}